

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_meta.cpp
# Opt level: O0

MPP_RET mpp_meta_get_with_tag(MppMeta *meta,char *tag,char *caller)

{
  MppMetaService *this;
  MppMetaImpl *pMVar1;
  MppMetaImpl *impl;
  MppMetaService *service;
  char *caller_local;
  char *tag_local;
  MppMeta *meta_local;
  
  if (meta == (MppMeta *)0x0) {
    _mpp_log_l(2,"mpp_meta","found NULL input\n","mpp_meta_get_with_tag");
    meta_local._4_4_ = MPP_ERR_NULL_PTR;
  }
  else {
    this = MppMetaService::get_inst();
    pMVar1 = MppMetaService::get_meta(this,tag,caller);
    *meta = pMVar1;
    meta_local._4_4_ = MPP_NOK;
    if (pMVar1 != (MppMetaImpl *)0x0) {
      meta_local._4_4_ = MPP_OK;
    }
  }
  return meta_local._4_4_;
}

Assistant:

MPP_RET mpp_meta_get_with_tag(MppMeta *meta, const char *tag, const char *caller)
{
    if (NULL == meta) {
        mpp_err_f("found NULL input\n");
        return MPP_ERR_NULL_PTR;
    }

    MppMetaService *service = MppMetaService::get_inst();
    MppMetaImpl *impl = service->get_meta(tag, caller);
    *meta = (MppMeta) impl;
    return (impl) ? (MPP_OK) : (MPP_NOK);
}